

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_context.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::Context::InitializeFieldGeneratorInfoForFields
          (Context *this,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *buffer;
  FieldDescriptor *this_00;
  bool bVar1;
  int iVar2;
  long *plVar3;
  LogMessage *pLVar4;
  pointer ppFVar5;
  mapped_type *pmVar6;
  long *plVar7;
  java *pjVar8;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *pFVar9;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *extraout_RDX_06;
  FieldDescriptor *extraout_RDX_07;
  FieldDescriptor *extraout_RDX_08;
  FieldDescriptor *extraout_RDX_09;
  FieldDescriptor *extraout_RDX_10;
  FieldDescriptor *extraout_RDX_11;
  FieldDescriptor *extraout_RDX_12;
  FieldDescriptor *extraout_RDX_13;
  difference_type __n;
  ulong uVar10;
  FieldDescriptor *pFVar11;
  long lVar12;
  FieldDescriptor *field;
  vector<bool,_std::allocator<bool>_> is_conflict;
  FieldGeneratorInfo info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  conflict_reason;
  long *local_1c0;
  long local_1b8;
  long local_1b0;
  long lStack_1a8;
  FieldDescriptor *local_1a0;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_198;
  java *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  vector<bool,_std::allocator<bool>_> local_170;
  long *local_148;
  long local_140;
  long local_138;
  long lStack_130;
  string local_128;
  undefined1 local_f8 [32];
  char *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 local_a8 [16];
  Context *local_98;
  long local_90;
  ulong local_88;
  ulong local_80;
  FieldDescriptor *local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  FieldDescriptor *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_f8._0_8_ = local_f8._0_8_ & 0xffffffffffffff00;
  local_98 = this;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_170,
             (long)(fields->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(fields->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3,(bool *)local_f8,
             (allocator_type *)&local_128);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_70,
           (long)(fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)local_f8);
  ppFVar5 = (fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pFVar9 = extraout_RDX;
  local_198 = fields;
  if ((fields->
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar5) {
    local_88 = 1;
    local_90 = 0x20;
    pFVar9 = extraout_RDX;
    pFVar11 = (FieldDescriptor *)0x0;
    do {
      this_00 = ppFVar5[(long)pFVar11];
      UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_128,(java *)this_00,pFVar9);
      local_58 = pFVar11 + 1;
      ppFVar5 = (fields->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_1a0 = pFVar11;
      if (local_58 <
          (FieldDescriptor *)
          ((long)(fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5 >> 3)) {
        pFVar9 = (FieldDescriptor *)(1L << ((byte)pFVar11 & 0x3f));
        local_80 = (ulong)pFVar11 >> 6;
        uVar10 = local_88;
        lVar12 = local_90;
        local_78 = pFVar9;
        do {
          pjVar8 = (java *)ppFVar5[uVar10];
          UnderscoresToCapitalizedCamelCase_abi_cxx11_((string *)local_f8,pjVar8,pFVar9);
          if (local_128._M_string_length == local_f8._8_8_) {
            if ((char *)local_128._M_string_length != (char *)0x0) {
              iVar2 = bcmp(local_128._M_dataplus._M_p,(void *)local_f8._0_8_,
                           local_128._M_string_length);
              if (iVar2 != 0) goto LAB_002ecb8c;
            }
            local_170.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar10 >> 6] =
                 local_170.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar10 >> 6] |
                 1L << ((byte)uVar10 & 0x3f);
            local_170.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[local_80] =
                 local_170.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[local_80] |
                 (ulong)local_78;
            std::operator+(&local_50,"capitalized name of field \"",
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            (this_00 + 8));
            plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
            local_148 = &local_138;
            plVar7 = plVar3 + 2;
            if ((long *)*plVar3 == plVar7) {
              local_138 = *plVar7;
              lStack_130 = plVar3[3];
            }
            else {
              local_138 = *plVar7;
              local_148 = (long *)*plVar3;
            }
            local_140 = plVar3[1];
            *plVar3 = (long)plVar7;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            plVar3 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_148,**(ulong **)(pjVar8 + 8));
            local_190 = (java *)&local_180;
            pjVar8 = (java *)(plVar3 + 2);
            if ((java *)*plVar3 == pjVar8) {
              local_180 = *(long *)pjVar8;
              lStack_178 = plVar3[3];
            }
            else {
              local_180 = *(long *)pjVar8;
              local_190 = (java *)*plVar3;
            }
            local_188 = plVar3[1];
            *plVar3 = (long)pjVar8;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            plVar3 = (long *)std::__cxx11::string::append((char *)&local_190);
            local_1c0 = &local_1b0;
            plVar7 = plVar3 + 2;
            if ((long *)*plVar3 == plVar7) {
              local_1b0 = *plVar7;
              lStack_1a8 = plVar3[3];
            }
            else {
              local_1b0 = *plVar7;
              local_1c0 = (long *)*plVar3;
            }
            local_1b8 = plVar3[1];
            *plVar3 = (long)plVar7;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            std::__cxx11::string::operator=
                      ((string *)
                       ((long)&((local_70.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar12),(string *)&local_1c0);
            std::__cxx11::string::_M_assign
                      ((string *)
                       (local_70.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)local_1a0));
            pFVar9 = extraout_RDX_02;
            if (local_1c0 != &local_1b0) {
              operator_delete(local_1c0);
              pFVar9 = extraout_RDX_03;
            }
            if (local_190 != (java *)&local_180) {
              operator_delete(local_190);
              pFVar9 = extraout_RDX_04;
            }
            if (local_148 != &local_138) {
              operator_delete(local_148);
              pFVar9 = extraout_RDX_05;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
              pFVar9 = extraout_RDX_06;
            }
          }
          else {
LAB_002ecb8c:
            bVar1 = anon_unknown_7::IsConflicting
                              (this_00,&local_128,(FieldDescriptor *)pjVar8,(string *)local_f8,
                               (string *)
                               ((long)&((local_70.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar12));
            pFVar9 = extraout_RDX_00;
            if (bVar1) {
              local_170.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[uVar10 >> 6] =
                   local_170.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar10 >> 6] |
                   1L << ((byte)uVar10 & 0x3f);
              local_170.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[local_80] =
                   local_170.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[local_80] |
                   (ulong)local_78;
              std::__cxx11::string::_M_assign
                        ((string *)
                         (local_70.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)local_1a0));
              pFVar9 = extraout_RDX_01;
            }
          }
          if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
            operator_delete((void *)local_f8._0_8_);
            pFVar9 = extraout_RDX_07;
          }
          uVar10 = uVar10 + 1;
          ppFVar5 = (local_198->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar12 = lVar12 + 0x20;
        } while (uVar10 < (ulong)((long)(local_198->
                                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5
                                 >> 3));
      }
      fields = local_198;
      pFVar9 = local_1a0;
      if ((local_170.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[(ulong)local_1a0 >> 6] >>
           ((ulong)local_1a0 & 0x3f) & 1) != 0) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_f8,LOGLEVEL_WARNING,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_context.cc"
                   ,0x96);
        pLVar4 = internal::LogMessage::operator<<((LogMessage *)local_f8,"field \"");
        pLVar4 = internal::LogMessage::operator<<(pLVar4,(string *)(*(long *)(this_00 + 8) + 0x20));
        pLVar4 = internal::LogMessage::operator<<(pLVar4,"\" is conflicting ");
        pLVar4 = internal::LogMessage::operator<<(pLVar4,"with another field: ");
        pLVar4 = internal::LogMessage::operator<<
                           (pLVar4,local_70.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + (long)pFVar9);
        internal::LogFinisher::operator=((LogFinisher *)&local_1c0,pLVar4);
        internal::LogMessage::~LogMessage((LogMessage *)local_f8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      ppFVar5 = (fields->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_88 = local_88 + 1;
      local_90 = local_90 + 0x20;
      pFVar9 = local_58;
      pFVar11 = local_58;
    } while (local_58 <
             (FieldDescriptor *)
             ((long)(fields->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5 >> 3));
  }
  ppFVar5 = (fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((fields->
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar5) {
    buffer = &local_128.field_2;
    local_98 = (Context *)&local_98->field_generator_info_map_;
    uVar10 = 0;
    do {
      local_190 = (java *)ppFVar5[uVar10];
      local_f8._0_8_ = local_f8 + 0x10;
      local_f8._8_8_ = (char *)0x0;
      local_f8[0x10] = 0;
      local_d8 = local_d0._M_local_buf + 8;
      local_d0._M_allocated_capacity = 0;
      local_d0._M_local_buf[8] = '\0';
      local_b8 = local_a8;
      local_b0 = 0;
      local_a8[0] = 0;
      CamelCaseFieldName_abi_cxx11_(&local_128,local_190,pFVar9);
      std::__cxx11::string::operator=((string *)local_f8,(string *)&local_128);
      pFVar9 = extraout_RDX_08;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != buffer) {
        operator_delete(local_128._M_dataplus._M_p);
        pFVar9 = extraout_RDX_09;
      }
      UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_128,local_190,pFVar9);
      std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != buffer) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      if ((local_170.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0) {
        local_128._M_dataplus._M_p = (pointer)buffer;
        local_128._M_string_length =
             (size_type)FastInt32ToBufferLeft(*(int32 *)(local_190 + 4),buffer->_M_local_buf);
        local_128._M_string_length = local_128._M_string_length - (long)buffer;
        local_1c0 = &local_1b0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1c0,local_128._M_dataplus._M_p,
                   local_128._M_dataplus._M_p + local_128._M_string_length);
        std::__cxx11::string::_M_append(local_f8,(ulong)local_1c0);
        if (local_1c0 != &local_1b0) {
          operator_delete(local_1c0);
        }
        local_128._M_dataplus._M_p = (pointer)buffer;
        local_128._M_string_length =
             (size_type)FastInt32ToBufferLeft(*(int32 *)(local_190 + 4),buffer->_M_local_buf);
        local_128._M_string_length = local_128._M_string_length + -(long)buffer;
        local_1c0 = &local_1b0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1c0,local_128._M_dataplus._M_p,
                   (char *)(local_128._M_string_length + (long)local_128._M_dataplus._M_p));
        std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_1c0);
        if (local_1c0 != &local_1b0) {
          operator_delete(local_1c0);
        }
        std::__cxx11::string::_M_assign((string *)&local_b8);
      }
      pmVar6 = std::
               map<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::FieldGeneratorInfo,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::compiler::java::FieldGeneratorInfo>_>_>
               ::operator[]((map<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::FieldGeneratorInfo,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::compiler::java::FieldGeneratorInfo>_>_>
                             *)local_98,(key_type *)&local_190);
      std::__cxx11::string::_M_assign((string *)pmVar6);
      std::__cxx11::string::_M_assign((string *)&pmVar6->capitalized_name);
      std::__cxx11::string::_M_assign((string *)&pmVar6->disambiguated_reason);
      pFVar9 = extraout_RDX_10;
      if (local_b8 != local_a8) {
        operator_delete(local_b8);
        pFVar9 = extraout_RDX_11;
      }
      if (local_d8 != local_d0._M_local_buf + 8) {
        operator_delete(local_d8);
        pFVar9 = extraout_RDX_12;
      }
      if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
        operator_delete((void *)local_f8._0_8_);
        pFVar9 = extraout_RDX_13;
      }
      uVar10 = uVar10 + 1;
      ppFVar5 = (local_198->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(local_198->
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5 >> 3
                             ));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70);
  if (local_170.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_170.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void Context::InitializeFieldGeneratorInfoForFields(
    const std::vector<const FieldDescriptor*>& fields) {
  // Find out all fields that conflict with some other field in the same
  // message.
  std::vector<bool> is_conflict(fields.size());
  std::vector<std::string> conflict_reason(fields.size());
  for (int i = 0; i < fields.size(); ++i) {
    const FieldDescriptor* field = fields[i];
    const std::string& name = UnderscoresToCapitalizedCamelCase(field);
    for (int j = i + 1; j < fields.size(); ++j) {
      const FieldDescriptor* other = fields[j];
      const std::string& other_name = UnderscoresToCapitalizedCamelCase(other);
      if (name == other_name) {
        is_conflict[i] = is_conflict[j] = true;
        conflict_reason[i] = conflict_reason[j] =
            "capitalized name of field \"" + field->name() +
            "\" conflicts with field \"" + other->name() + "\"";
      } else if (IsConflicting(field, name, other, other_name,
                               &conflict_reason[j])) {
        is_conflict[i] = is_conflict[j] = true;
        conflict_reason[i] = conflict_reason[j];
      }
    }
    if (is_conflict[i]) {
      GOOGLE_LOG(WARNING) << "field \"" << field->full_name() << "\" is conflicting "
                   << "with another field: " << conflict_reason[i];
    }
  }
  for (int i = 0; i < fields.size(); ++i) {
    const FieldDescriptor* field = fields[i];
    FieldGeneratorInfo info;
    info.name = CamelCaseFieldName(field);
    info.capitalized_name = UnderscoresToCapitalizedCamelCase(field);
    // For fields conflicting with some other fields, we append the field
    // number to their field names in generated code to avoid conflicts.
    if (is_conflict[i]) {
      info.name += StrCat(field->number());
      info.capitalized_name += StrCat(field->number());
      info.disambiguated_reason = conflict_reason[i];
    }
    field_generator_info_map_[field] = info;
  }
}